

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function-c.cpp
# Opt level: O2

void duckdb::CAPIAggregateCombine
               (Vector *state,Vector *combined,AggregateInputData *aggr_input_data,idx_t count)

{
  FunctionData *pFVar1;
  InvalidInputException *this;
  CAggregateExecuteInfo exec_info;
  
  Vector::Flatten(state,count);
  pFVar1 = optional_ptr<duckdb::FunctionData,_true>::operator->(&aggr_input_data->bind_data);
  exec_info.info = (CAggregateFunctionInfo *)pFVar1[1]._vptr_FunctionData;
  exec_info.success = true;
  exec_info.error._M_dataplus._M_p = (pointer)&exec_info.error.field_2;
  exec_info.error._M_string_length = 0;
  exec_info.error.field_2._M_local_buf[0] = '\0';
  (*(exec_info.info)->combine)(&exec_info,state->data,combined->data,count);
  if (exec_info.success != false) {
    ::std::__cxx11::string::~string((string *)&exec_info.error);
    return;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  InvalidInputException::InvalidInputException(this,(string *)&exec_info.error);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CAPIAggregateCombine(Vector &state, Vector &combined, AggregateInputData &aggr_input_data, idx_t count) {
	state.Flatten(count);
	auto &bind_data = aggr_input_data.bind_data->Cast<CAggregateFunctionBindData>();
	auto input_state_data = FlatVector::GetData<duckdb_aggregate_state>(state);
	auto result_state_data = FlatVector::GetData<duckdb_aggregate_state>(combined);
	CAggregateExecuteInfo exec_info(bind_data.info);
	auto c_function_info = reinterpret_cast<duckdb_function_info>(&exec_info);
	bind_data.info.combine(c_function_info, input_state_data, result_state_data, count);
	if (!exec_info.success) {
		throw InvalidInputException(exec_info.error);
	}
}